

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O3

void flush(NMQ *q)

{
  dlist *list;
  dlist *list_00;
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  dlist_s *pdVar4;
  segment *psVar5;
  int8_t iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  segment *psVar10;
  int64_t iVar12;
  segment *buf_00;
  uint32_t uVar13;
  uint32_t uVar14;
  segment *s;
  uint32_t *puVar15;
  dlist_s *node;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  char buf [24];
  char buf_1 [1600];
  int local_6cc;
  char local_698 [32];
  segment local_678 [25];
  ulong uVar11;
  
  if ((q->probe_pending != '\0') && (q->ts_probe_wait <= q->current)) {
    local_678[0].len = 0;
    local_678[0].data[0] = '\0';
    local_678[0]._61_3_ = 0;
    local_678[0].resendts = 0;
    local_678[0].n_sent = 0;
    local_678[0].rto = 0;
    local_678[0].dupacks = 0;
    local_678[0]._30_2_ = 0;
    local_678[0].head.prev = (dlist_s *)0x0;
    local_678[0].head.next = (dlist_s *)0x0;
    local_678[0].cmd = 3;
    local_678[0].conv = q->conv;
    local_678[0]._37_3_ = 0;
    local_678[0].sendts = 0;
    local_678[0].una = q->rcv_nxt;
    local_678[0]._40_8_ = (ulong)(ushort)((short)q->MAX_RCV_BUF_NUM - (short)q->nrcv_buf) << 0x30;
    local_698[0] = '\0';
    local_698[1] = '\0';
    local_698[2] = '\0';
    local_698[3] = '\0';
    local_698[4] = '\0';
    local_698[5] = '\0';
    local_698[6] = '\0';
    local_698[7] = '\0';
    local_698[8] = '\0';
    local_698[9] = '\0';
    local_698[10] = '\0';
    local_698[0xb] = '\0';
    local_698[0xc] = '\0';
    local_698[0xd] = '\0';
    local_698[0xe] = '\0';
    local_698[0xf] = '\0';
    local_698[0x10] = '\0';
    local_698[0x11] = '\0';
    local_698[0x12] = '\0';
    local_698[0x13] = '\0';
    local_698[0x14] = '\0';
    local_698[0x15] = '\0';
    local_698[0x16] = '\0';
    local_698[0x17] = '\0';
    pcVar9 = encode_seg_and_data(local_678,local_698);
    nmq_output(q,local_698,(int)pcVar9 - (int)local_698);
    q->probe_pending = '\0';
    q->ts_probe_wait = 0;
  }
  uVar11 = (ulong)q->ackcount;
  if (uVar11 == 0) {
    if (q->ack_failures != 0) {
      local_678[0].len = 0;
      local_678[0].data[0] = '\0';
      local_678[0]._61_3_ = 0;
      local_678[0].resendts = 0;
      local_678[0].n_sent = 0;
      local_678[0].rto = 0;
      local_678[0].dupacks = 0;
      local_678[0]._30_2_ = 0;
      local_678[0].head.prev = (dlist_s *)0x0;
      local_678[0].head.next = (dlist_s *)0x0;
      local_678[0].cmd = 4;
      local_678[0].conv = q->conv;
      local_678[0]._37_3_ = 0;
      local_678[0].sendts = 0;
      local_678[0].una = q->rcv_nxt;
      local_678[0]._40_8_ = (ulong)(ushort)((short)q->MAX_RCV_BUF_NUM - (short)q->nrcv_buf) << 0x30;
      local_698[0] = '\0';
      local_698[1] = '\0';
      local_698[2] = '\0';
      local_698[3] = '\0';
      local_698[4] = '\0';
      local_698[5] = '\0';
      local_698[6] = '\0';
      local_698[7] = '\0';
      local_698[8] = '\0';
      local_698[9] = '\0';
      local_698[10] = '\0';
      local_698[0xb] = '\0';
      local_698[0xc] = '\0';
      local_698[0xd] = '\0';
      local_698[0xe] = '\0';
      local_698[0xf] = '\0';
      local_698[0x10] = '\0';
      local_698[0x11] = '\0';
      local_698[0x12] = '\0';
      local_698[0x13] = '\0';
      local_698[0x14] = '\0';
      local_698[0x15] = '\0';
      local_698[0x16] = '\0';
      local_698[0x17] = '\0';
      pcVar9 = encode_seg_and_data(local_678,local_698);
      nmq_output(q,local_698,(int)pcVar9 - (int)local_698);
      q->probe_pending = '\0';
      q->ts_probe_wait = 0;
    }
    q->ack_failures = 0;
  }
  else {
    uVar17 = q->MSS;
    lVar16 = 0;
    do {
      decode_uint32((uint32_t *)local_678,(char *)((long)q->acklist + lVar16));
      lVar16 = lVar16 + 8;
    } while (uVar11 << 3 != lVar16);
    uVar7 = uVar17 >> 3;
    psVar10 = obtain_segment(&q->pool);
    psVar10->sn = 0;
    psVar10->conv = q->conv;
    psVar10->cmd = '\x02';
    psVar10->una = q->rcv_nxt;
    psVar10->wnd = (short)q->MAX_RCV_BUF_NUM - (short)q->nrcv_buf;
    psVar10->frag = '\0';
    psVar10->sendts = 0;
    puVar15 = q->acklist;
    memset(local_678,0,0x640);
    uVar17 = uVar17 & 0xfffffff8;
    do {
      uVar19 = (uint)uVar11;
      uVar18 = uVar19 - uVar7;
      if (uVar19 < uVar7 || uVar18 == 0) {
        uVar11 = (ulong)(uVar19 << 3);
        psVar10->len = uVar19 << 3;
        memcpy(psVar10->data,puVar15,uVar11);
        uVar18 = 0;
      }
      else {
        psVar10->len = uVar17;
        memcpy(psVar10->data,puVar15,(ulong)uVar17);
        uVar11 = (ulong)uVar17;
      }
      puVar15 = (uint32_t *)((long)puVar15 + uVar11);
      pcVar9 = encode_seg_and_data(psVar10,(char *)local_678);
      nmq_output(q,(char *)local_678,(int)pcVar9 - (int)local_678);
      uVar11 = (ulong)uVar18;
    } while (uVar18 != 0);
    recycle_segment(&q->pool,psVar10);
    q->ackcount = 0;
    q->ack_failures = 0;
  }
  uVar11 = MIN((ulong)q->MAX_SND_BUF_NUM,(ulong)q->rmt_wnd);
  iVar8 = (int)uVar11;
  if (q->fc_on != '\0') {
    iVar12 = MIN(uVar11 & 0xffffffff,(ulong)(q->fc).cwnd);
    iVar8 = (int)iVar12;
  }
  list = &q->snd_que;
  node = (q->snd_que).next;
  if (node != list) {
    do {
      uVar17 = q->snd_nxt;
      if (q->snd_una + iVar8 <= uVar17) break;
      pdVar4 = node->next;
      q->snd_nxt = uVar17 + 1;
      *(uint *)&node[2].next = uVar17;
      dlist_remove_node(node);
      dlist_add_tail(&q->snd_buf,node);
      q->snd_sn_to_node
      [(ulong)(*(int *)&node[2].next + q->MAX_SND_BUF_NUM) % (ulong)q->MAX_SND_BUF_NUM] = node;
      q->nsnd_que = q->nsnd_que - 1;
      node = pdVar4;
    } while (pdVar4 != list);
  }
  uVar17 = q->current;
  uVar13 = q->nrcv_buf;
  uVar2 = q->MAX_RCV_BUF_NUM;
  cVar1 = (q->fc).DUP_ACK_LIM;
  local_6cc = 0;
  memset(local_678,0,0x640);
  list_00 = &q->snd_buf;
  psVar10 = (segment *)(q->snd_buf).next;
  uVar3 = 0;
  iVar8 = 0;
  if (psVar10 != (segment *)list_00) {
    local_6cc = 0;
    uVar7 = 0;
    buf_00 = local_678;
    uVar3 = 0;
    iVar8 = 0;
    do {
      psVar5 = (segment *)(psVar10->head).next;
      if (psVar10->n_sent == 0) {
        uVar14 = q->rto;
        psVar10->rto = uVar14;
LAB_00101723:
        uVar18 = psVar10->len;
        if ((q->steady_on != '\0') && (uVar7 = uVar7 + uVar18 + 0x18, q->BYTES_PER_FLUSH < uVar7))
        break;
        psVar10->n_sent = psVar10->n_sent + 1;
        psVar10->wnd = (short)uVar2 - (short)uVar13;
        psVar10->una = q->rcv_nxt;
        psVar10->sendts = uVar17;
        psVar10->resendts = uVar14 + uVar17;
        lVar16 = (long)buf_00 - (long)local_678;
        if ((long)(ulong)q->MSS <= (long)(lVar16 + (ulong)uVar18)) {
          nmq_output(q,(char *)local_678,(int)lVar16);
          uVar18 = psVar10->len;
          buf_00 = local_678;
        }
        puVar15 = &(q->stat).bytes_send_tot;
        *puVar15 = *puVar15 + uVar18;
        buf_00 = (segment *)encode_seg_and_data(psVar10,(char *)buf_00);
        if (((q->MAX_PKT_TRY < psVar10->n_sent) && (q->state == -1)) &&
           (q->failure_cb != (_func_void_nmq_s_ptr_uint32_t *)0x0)) {
          (*q->failure_cb)(q,psVar10->sn);
        }
      }
      else {
        if (psVar10->resendts <= uVar17) {
          uVar14 = (q->rto >> (q->nodelay != '\0')) + psVar10->rto;
          if (59999 < (int)uVar14) {
            uVar14 = 60000;
          }
          uVar3 = psVar10->sn;
          psVar10->rto = uVar14;
          iVar8 = iVar8 + 1;
          psVar10->dupacks = 0;
          goto LAB_00101723;
        }
        if ((int)cVar1 <= (int)(uint)psVar10->dupacks) {
          uVar3 = psVar10->sn;
          psVar10->rto = 200;
          local_6cc = local_6cc + 1;
          psVar10->dupacks = 0;
          uVar14 = 200;
          goto LAB_00101723;
        }
      }
      psVar10 = psVar5;
    } while (psVar5 != (segment *)list_00);
    if (local_678 < buf_00) {
      nmq_output(q,(char *)local_678,(int)buf_00 - (int)local_678);
    }
  }
  if (((iVar8 + local_6cc != 0) && ((q->fc).in_trouble == '\0')) &&
     ((uint)(q->fc).TROUBLE_TOLERANCE <= (uint)(iVar8 + local_6cc))) {
    (q->fc).in_trouble = '\x01';
    (q->fc).max_lost_sn = uVar3;
    iVar12 = MAX(2,(long)((float)(q->fc).cwnd * (q->fc).ssth_alpha));
    uVar13 = (uint32_t)iVar12;
    (q->fc).ssthresh = uVar13;
    (q->fc).cwnd = uVar13;
    if (local_6cc != 0) {
      uVar13 = (int)(q->fc).DUP_ACK_LIM + uVar13;
      (q->fc).cwnd = uVar13;
    }
    (q->fc).incr = (float)(uVar13 * (q->fc).MSS);
  }
  rcvbuf2q(q);
  if ((q->rmt_wnd == 0) && (q->probe_pending == '\0')) {
    q->probe_pending = '\x01';
    q->ts_probe_wait = q->current + 500;
  }
  if (((q->fin_sn != '\0') && (iVar6 = list_not_empty(list), iVar6 == '\0')) &&
     (iVar6 = list_not_empty(list_00), iVar6 == '\0')) {
    nmq_output(q,(char *)0x0,-1);
  }
  return;
}

Assistant:

static void flush(NMQ *q) {

    window_probe_req2peer_if_need(q);

    acks2peer(q);

    sndq2buf(q);

    flush_snd_buf(q);

    rcvbuf2q(q);

    window_probe_build_req_if_need(q);

    check_send_done(q);
}